

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

String * __thiscall kj::_::Event::traceEvent(String *__return_storage_ptr__,Event *this)

{
  TraceBuilder *params;
  TraceBuilder builder;
  void *space [32];
  undefined1 *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  undefined1 local_128 [256];
  undefined1 local_28 [8];
  
  memset(local_128,0,0x100);
  local_130 = local_28;
  local_140 = local_128;
  local_138 = local_128;
  (**this->_vptr_Event)(this,(kj *)&local_140);
  str<kj::_::TraceBuilder&>(__return_storage_ptr__,(kj *)&local_140,params);
  return __return_storage_ptr__;
}

Assistant:

String Event::traceEvent() {
  void* space[32]{};
  TraceBuilder builder(space);
  traceEvent(builder);
  return kj::str(builder);
}